

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

void __thiscall
Js::JavascriptBigInt::InitFromCharDigits<char16_t>
          (JavascriptBigInt *this,char16_t *pChar,uint32 charLength,bool isNegative)

{
  code *pcVar1;
  undefined8 this_00;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_01;
  unsigned_long *ptr;
  char16_t *pcVar4;
  digit_t digitAdd;
  ulong digitMul;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  if (pChar == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x94,"(pChar != 0)","pChar != 0");
    if (!bVar2) goto LAB_00bc99b1;
    *puVar3 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  this->m_length = 0;
  pcVar4 = pChar + ((ulong)charLength - 1);
  data.plusSize = this->m_maxLength;
  local_68 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80f2896;
  data.filename._0_4_ = 0x99;
  this_01 = Memory::Recycler::TrackAllocInfo
                      (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                       (TrackAllocData *)local_68);
  digitAdd = 0;
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                  ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocLeaf,0,this->m_maxLength);
  Memory::WriteBarrierPtr<unsigned_long>::WriteBarrierSet(&this->m_digits,ptr);
  this->m_isNegative = isNegative;
  digitMul = 1;
  data._32_8_ = this;
  for (; this_00 = data._32_8_, pChar < pcVar4; pChar = pChar + 1) {
    bVar2 = NumberUtilities::IsDigit((uint)(ushort)*pChar);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                  ,0xa0,"(NumberUtilities::IsDigit(*pChar))",
                                  "NumberUtilities::IsDigit(*pChar)");
      if (!bVar2) goto LAB_00bc99b1;
      *puVar3 = 0;
    }
    if (digitMul == 1000000000) {
      MulThenAdd((JavascriptBigInt *)data._32_8_,1000000000,digitAdd);
      digitMul = 1;
      digitAdd = 0;
    }
    digitMul = digitMul * 10;
    digitAdd = (digitAdd * 10 + (ulong)(ushort)*pChar) - 0x30;
  }
  if (digitMul < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0xaa,"(1 < digitMul)","1 < digitMul");
    if (!bVar2) {
LAB_00bc99b1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  MulThenAdd((JavascriptBigInt *)this_00,digitMul,digitAdd);
  if (*(long *)(this_00 + 0x18) == 0) {
    *(undefined1 *)(this_00 + 0x28) = 0;
    *(undefined8 *)(this_00 + 0x18) = 1;
    **(undefined8 **)(this_00 + 0x10) = 0;
  }
  return;
}

Assistant:

void JavascriptBigInt::InitFromCharDigits(const EncodedChar *pChar, uint32 charLength, bool isNegative)
    {
        Assert(charLength >= 0);
        Assert(pChar != 0);

        const EncodedChar *pCharLimit = pChar + charLength - 1;//'n' at the end

        m_length = 0;
        m_digits = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), digit_t, m_maxLength);
        m_isNegative = isNegative;

        digit_t digitMul = 1;
        digit_t digitAdd = 0;
        for (; pChar < pCharLimit; pChar++)
        {
            Assert(NumberUtilities::IsDigit(*pChar));
            if (digitMul == 1e9)
            {
                MulThenAdd(digitMul, digitAdd);
                digitMul = 1;
                digitAdd = 0;
            }
            digitMul *= 10;
            digitAdd = digitAdd * 10 + *pChar - '0';
        }
        Assert(1 < digitMul);
        MulThenAdd(digitMul, digitAdd);

        // make sure this is no negative zero
        if (m_length == 0)
        {
            m_isNegative = false;
            m_length = 1;
            m_digits[0] = 0;
        }
    }